

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O1

wchar_t display_page(equippable_summary *s,player *p,_Bool allow_reconfig)

{
  uint uVar1;
  wchar_t wVar2;
  equippable_source eVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  long lVar6;
  size_t sVar7;
  wchar_t *pwVar8;
  wchar_t wVar9;
  wchar_t wVar10;
  undefined7 in_register_00000011;
  long lVar11;
  long lVar12;
  equippable *peVar13;
  prop_category *ppVar14;
  ui_entry_details rdetails;
  ui_entry_details local_64;
  prop_category *local_40;
  long local_38;
  
  if (((int)CONCAT71(in_register_00000011,allow_reconfig) != 0) &&
     (wVar4 = reconfigure_for_term_if_necessary(true,p,s), wVar4 != L'\0')) {
    return L'\x01';
  }
  local_64.label_position.x = s->nshortnm + s->icol_name + L'\x01';
  local_64.value_position.y = s->irow_combined_equip;
  local_64.label_position.y = local_64.value_position.y - s->nproplab;
  lVar6 = 0;
  local_64.value_position.x = local_64.label_position.x;
  local_64.position_step = (loc)loc(1,0);
  local_64.combined_position = (loc)loc(0,0);
  local_64.vertical_label = false;
  local_64.alternate_color_first = false;
  local_64.show_combined = false;
  Term_putch(s->icol_name + L'\xfffffffc',local_64.value_position.y,L'\x01',L'@');
  local_40 = s->propcats;
  uVar1 = 0;
  do {
    ppVar14 = local_40 + lVar6;
    local_38 = lVar6;
    if ((ppVar14->nvw[s->iview] != L'\0') && (lVar6 = (long)s->iview, L'\0' < ppVar14->nvw[lVar6]))
    {
      wVar4 = L'\0';
      do {
        lVar6 = (long)wVar4 + (long)ppVar14->ivw[lVar6];
        if (L'\0' < s->nproplab) {
          lVar12 = 0;
          do {
            Term_putch(local_64.label_position.x,local_64.label_position.y + (int)lVar12,
                       (uVar1 & 1) * 8 + L'\x01',ppVar14->labels[lVar6][lVar12]);
            lVar12 = lVar12 + 1;
          } while (lVar12 < s->nproplab);
        }
        lVar6 = (long)(int)lVar6;
        local_64.known_rune = is_ui_entry_for_known_rune(ppVar14->entries[lVar6],p);
        wVar5 = get_ui_entry_renderer_index(ppVar14->entries[lVar6]);
        ui_entry_renderer_apply
                  (wVar5,(wchar_t *)0x0,L'\0',s->p_and_eq_vals + lVar6 + ppVar14->off,
                   s->p_and_eq_auxvals + lVar6 + ppVar14->off,L'\x01',&local_64);
        local_64.label_position.x = local_64.label_position.x + L'\x01';
        local_64.value_position.x = local_64.value_position.x + L'\x01';
        local_64.alternate_color_first = (_Bool)(local_64.alternate_color_first ^ 1);
        wVar4 = wVar4 + L'\x01';
        uVar1 = uVar1 + 1;
        lVar6 = (long)s->iview;
      } while (wVar4 < ppVar14->nvw[lVar6]);
    }
    lVar6 = local_38 + 1;
  } while (lVar6 != 5);
  if (L'\0' < s->npage) {
    wVar4 = L'\0';
    do {
      local_64.value_position.y = local_64.value_position.y + L'\x01';
      wVar5 = s->indinc * wVar4 + s->ifirst;
      if ((wVar5 < L'\0') || (s->nfilt <= wVar5)) {
        __assert_fail("icnv >= 0 && icnv < s->nfilt",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                      ,0xac7,
                      "int display_page(struct equippable_summary *, const struct player *, _Bool)")
        ;
      }
      wVar2 = s->sorted_indices[(uint)wVar5];
      if (((long)wVar2 < 0) || (s->nitems <= wVar2)) {
        __assert_fail("isort >= 0 && isort < s->nitems",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                      ,0xac9,
                      "int display_page(struct equippable_summary *, const struct player *, _Bool)")
        ;
      }
      peVar13 = s->items + wVar2;
      if ((tile_width == '\x01') && (tile_height == '\x01')) {
        wVar10 = (wchar_t)peVar13->at;
        wVar9 = peVar13->ch;
      }
      else {
        wVar10 = L'\x01';
        wVar9 = L' ';
      }
      Term_putch(s->icol_name + L'\xfffffffc',local_64.value_position.y,wVar10,wVar9);
      wVar10 = local_64.value_position.y;
      wVar9 = s->icol_name;
      eVar3 = peVar13->src;
      if (source_to_char_first_call == '\0') {
        sVar7 = text_mbstowcs((wchar_t *)source_to_char_wchars,"epfhs ",L'\a');
        if (sVar7 == 0xffffffffffffffff) {
          quit("Invalid encoding for item location codes");
        }
        source_to_char_first_call = '\x01';
      }
      pwVar8 = (wchar_t *)(source_to_char_wchars + 0x14);
      if (eVar3 < (EQUIP_SOURCE_STORE|EQUIP_SOURCE_PACK)) {
        pwVar8 = *(wchar_t **)(&DAT_00285b08 + (ulong)eVar3 * 8);
      }
      Term_putch(wVar9 + L'\xfffffffe',wVar10,L'\x01',*pwVar8);
      wVar9 = L'\x0e';
      if ((wVar2 != s->isel0) && (wVar2 != s->isel1)) {
        wVar9 = L'\x01';
        if (wVar5 == s->work_sel) {
          wVar9 = L'\x0e';
        }
      }
      Term_putstr(s->icol_name,local_64.value_position.y,peVar13->nmlen,wVar9,peVar13->short_name);
      local_64.value_position.x = s->nshortnm + s->icol_name + L'\x01';
      local_64.alternate_color_first = false;
      lVar6 = 0;
      do {
        ppVar14 = local_40 + lVar6;
        if ((ppVar14->nvw[s->iview] != L'\0') &&
           (lVar12 = (long)s->iview, L'\0' < ppVar14->nvw[lVar12])) {
          lVar11 = 0;
          do {
            lVar12 = ppVar14->ivw[lVar12] + lVar11;
            wVar5 = get_ui_entry_renderer_index(ppVar14->entries[lVar12]);
            ui_entry_renderer_apply
                      (wVar5,(wchar_t *)0x0,L'\0',peVar13->vals + lVar12 + ppVar14->off,
                       peVar13->auxvals + lVar12 + ppVar14->off,L'\x01',&local_64);
            local_64.value_position.x = local_64.value_position.x + L'\x01';
            local_64.alternate_color_first = (_Bool)(local_64.alternate_color_first ^ 1);
            lVar12 = (long)s->iview;
            lVar11 = lVar11 + 1;
          } while ((wchar_t)lVar11 < ppVar14->nvw[lVar12]);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 5);
      wVar4 = wVar4 + L'\x01';
    } while (wVar4 < s->npage);
  }
  return L'\0';
}

Assistant:

static int display_page(struct equippable_summary *s, const struct player *p,
	bool allow_reconfig)
{
	struct ui_entry_details rdetails;
	int color = (COLOUR_WHITE);
	int i, ilab;

	/* Try to handle terminal size changes while displaying the summary. */
	if (allow_reconfig) {
		if (reconfigure_for_term_if_necessary(true, p, s)) {
			return 1;
		}
	}

	/*
	 * Display the column labels and the combined values for @ and the
	 * current equipment.  The display of the labels bypasses what's
	 * done by ui_entry_renderer_apply() so the color of the label can
	 * alternate between columns.
	 */
	rdetails.label_position.x = s->icol_name + s->nshortnm + 1;
	rdetails.label_position.y = s->irow_combined_equip - s->nproplab;
	rdetails.value_position.x = rdetails.label_position.x;
	rdetails.value_position.y = s->irow_combined_equip;
	rdetails.position_step = loc(1, 0);
	rdetails.combined_position = loc(0, 0);
	rdetails.vertical_label = false;
	rdetails.alternate_color_first = false;
	rdetails.show_combined = false;
	Term_putch(s->icol_name - 4, rdetails.value_position.y, color, L'@');
	for (i = 0, ilab = 0; i < (int)N_ELEMENTS(s->propcats); ++i) {
		int j;

		if (!s->propcats[i].nvw[s->iview]) {
			continue;
		}
		for (j = 0; j < s->propcats[i].nvw[s->iview]; ++j, ++ilab) {
			int joff = j + s->propcats[i].ivw[s->iview];
			/*
			 * As a hack, label colors are hardwired; it would be
			 * better if they configurable so they'd be consistent
			 * with the scheme for the symbol colors.
			 */
			int label_color = (ilab % 2 == 0) ?
				COLOUR_WHITE : COLOUR_L_WHITE;
			int k;

			for (k = 0; k < s->nproplab; ++k) {
				Term_putch(rdetails.label_position.x,
					rdetails.label_position.y + k,
					label_color,
					s->propcats[i].labels[joff][k]);
			}
			rdetails.known_rune = is_ui_entry_for_known_rune(
				s->propcats[i].entries[joff], p);
			ui_entry_renderer_apply(get_ui_entry_renderer_index(
				s->propcats[i].entries[joff]), NULL, 0,
				s->p_and_eq_vals + joff + s->propcats[i].off,
				s->p_and_eq_auxvals + joff +
				s->propcats[i].off, 1, &rdetails);
			++rdetails.label_position.x;
			++rdetails.value_position.x;
			rdetails.alternate_color_first =
				!rdetails.alternate_color_first;
		}
	}

	/* Display the items available on the current page. */
	++rdetails.value_position.y;
	for (i = 0; i < s->npage; ++i) {
		const struct equippable *e;
		int icnv, isort, j, nmcolor;

		icnv = s->ifirst + s->indinc * i;
		assert(icnv >= 0 && icnv < s->nfilt);
		isort = s->sorted_indices[icnv];
		assert(isort >= 0 && isort < s->nitems);
		e = s->items + isort;

		if (tile_width == 1 && tile_height == 1) {
			Term_putch(s->icol_name - 4, rdetails.value_position.y,
				e->at, e->ch);
		} else {
			/* No equippy chars with big tiles. */
			Term_putch(s->icol_name - 4, rdetails.value_position.y,
				COLOUR_WHITE, L' ');
		}
		Term_putch(s->icol_name - 2, rdetails.value_position.y, color,
			source_to_char(e->src));
		if (isort == s->isel0 || isort == s->isel1 ||
			icnv == s->work_sel) {
			nmcolor = (COLOUR_L_BLUE);
		} else {
			nmcolor = color;
		}
		Term_putstr(s->icol_name, rdetails.value_position.y,
			e->nmlen, nmcolor, e->short_name);
		rdetails.value_position.x = s->icol_name + s->nshortnm + 1;
		rdetails.alternate_color_first = false;
		for (j = 0; j < (int)N_ELEMENTS(s->propcats); ++j) {
			int k;

			if (!s->propcats[j].nvw[s->iview]) {
				continue;
			}
			for (k = 0; k < s->propcats[j].nvw[s->iview]; ++k) {
				int koff = k + s->propcats[j].ivw[s->iview];

				ui_entry_renderer_apply(
					get_ui_entry_renderer_index(
					s->propcats[j].entries[koff]), NULL, 0,
					e->vals + koff + s->propcats[j].off,
					e->auxvals + koff + s->propcats[j].off,
					1, &rdetails);
				++rdetails.value_position.x;
				rdetails.alternate_color_first =
					!rdetails.alternate_color_first;
			}
		}
		++rdetails.value_position.y;
	}

	return 0;
}